

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall
LinearScan::FillBailOutOffset
          (LinearScan *this,int *offset,StackSym *stackSym,FillBailOutState *state,Instr *instr)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  BailOutKind BVar5;
  SymID SVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  undefined4 *puVar10;
  LinearScan *this_00;
  RegNum reg;
  Lifetime *lifetime;
  anon_union_8_2_fd66ddfd_for_StackSym_35 local_50;
  uint local_44;
  LinearScan *local_40;
  Lifetime *local_38;
  
  local_40 = this;
  if (*offset != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x498,"(*offset == 0)",
                       "Can\'t have two active lifetime for the same byte code register");
    if (!bVar3) goto LAB_00534434;
    *puVar10 = 0;
  }
  bVar3 = StackSym::IsConst(stackSym);
  if (bVar3) {
    local_50.constantValue = StackSym::GetLiteralConstValue_PostGlobOpt(stackSym);
  }
  else {
    if ((*(uint *)&stackSym->field_0x18 & 0x40) == 0) {
      lifetime = *(Lifetime **)&(stackSym->scratch).globOpt;
      bVar3 = IR::Instr::HasLazyBailOut(instr);
      if (!bVar3) {
        if (lifetime != (Lifetime *)0x0) {
          local_44 = lifetime->start;
          uVar4 = IR::Instr::GetNumber(instr);
          if (local_44 < uVar4) {
            uVar4 = IR::Instr::GetNumber(instr);
            if (uVar4 <= lifetime->end) goto LAB_00534236;
          }
        }
        AssertCount = AssertCount + 1;
        local_38 = lifetime;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x4ab,
                           "(instr->HasLazyBailOut() || lifetime && lifetime->start < instr->GetNumber() && instr->GetNumber() <= lifetime->end)"
                           ,
                           "instr->HasLazyBailOut() || lifetime && lifetime->start < instr->GetNumber() && instr->GetNumber() <= lifetime->end"
                          );
        if (!bVar3) goto LAB_00534434;
        *puVar10 = 0;
        lifetime = local_38;
      }
LAB_00534236:
      BVar5 = IR::Instr::GetBailOutKind(instr);
      if (((BVar5 == BailOutOnException) && ((stackSym->field_0x19 & 0x10) == 0)) &&
         (local_40->currentRegion->exceptionObjectSym != stackSym)) {
        AssertCount = AssertCount + 1;
        local_38 = lifetime;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x4b1,
                           "(stackSym->IsAllocated() || (stackSym == this->currentRegion->GetExceptionObjectSym()))"
                           ,
                           "stackSym->IsAllocated() || (stackSym == this->currentRegion->GetExceptionObjectSym())"
                          );
        if (!bVar3) goto LAB_00534434;
        *puVar10 = 0;
        lifetime = local_38;
      }
      PrepareForUse(local_40,lifetime);
      bVar3 = IR::Instr::HasLazyBailOut(instr);
      if (bVar3) {
        this_00 = (LinearScan *)IR::Instr::GetBailOutInfo(instr);
        SVar6 = BailOutInfo::GetClearedUseOfDstId((BailOutInfo *)this_00);
        if (SVar6 != (stackSym->super_Sym).m_id) goto LAB_00534386;
        reg = RegRAX;
        instr = (Instr *)this_00;
LAB_00534424:
        iVar9 = SaveSymbolToReg((LinearScan *)instr,reg,state,stackSym);
      }
      else {
LAB_00534386:
        if ((lifetime->field_0x9c & 1) == 0) {
          BVar5 = IR::Instr::GetBailOutKind(instr);
          if ((BVar5 != BailOutOnException) ||
             (local_40->currentRegion->exceptionObjectSym == stackSym)) {
            reg = lifetime->reg;
            goto LAB_00534424;
          }
        }
        if (((stackSym->field_0x19 & 0x10) == 0) && ((lifetime->field_0x9c & 8) == 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar10 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x4ca,"(stackSym->IsAllocated() || lifetime->isDeadStore)",
                             "stackSym->IsAllocated() || lifetime->isDeadStore");
          if (!bVar3) {
LAB_00534434:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar10 = 0;
        }
        iVar9 = stackSym->m_offset + -0x10;
      }
      goto LAB_00534375;
    }
    if ((*(uint *)&stackSym->field_0x18 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x4a2,"(!stackSym->m_isSingleDef)","!stackSym->m_isSingleDef");
      if (!bVar3) goto LAB_00534434;
      *puVar10 = 0;
    }
    local_50 = stackSym->field_5;
  }
  SList<void_*,_Memory::ArenaAllocator,_RealCount>::Prepend
            ((SList<void_*,_Memory::ArenaAllocator,_RealCount> *)state,&local_50.m_instrDef);
  TVar1 = (state->constantList).super_SList<void_*,_Memory::ArenaAllocator,_RealCount>.
          super_SListBase<void_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.count;
  uVar7 = GetBailOutRegisterSaveSlotCount();
  uVar8 = GetBailOutReserveSlotCount();
  iVar9 = uVar8 + uVar7 + TVar1;
LAB_00534375:
  *offset = iVar9;
  return;
}

Assistant:

void
LinearScan::FillBailOutOffset(int * offset, StackSym * stackSym, FillBailOutState * state, IR::Instr * instr)
{
    AssertMsg(*offset == 0, "Can't have two active lifetime for the same byte code register");
    if (stackSym->IsConst())
    {
        state->constantList.Prepend(reinterpret_cast<Js::Var>(stackSym->GetLiteralConstValue_PostGlobOpt()));

        // Constant offset are offset by the number of register save slots
        *offset = state->constantList.Count() + GetBailOutRegisterSaveSlotCount() + GetBailOutReserveSlotCount();
    }
    else if (stackSym->m_isEncodedConstant)
    {
        Assert(!stackSym->m_isSingleDef);
        state->constantList.Prepend((Js::Var)stackSym->constantValue);

        // Constant offset are offset by the number of register save slots
        *offset = state->constantList.Count() + GetBailOutRegisterSaveSlotCount() + GetBailOutReserveSlotCount();
    }
    else
    {
        Lifetime * lifetime = stackSym->scratch.linearScan.lifetime;
        Assert(instr->HasLazyBailOut() || lifetime && lifetime->start < instr->GetNumber() && instr->GetNumber() <= lifetime->end);
        if (instr->GetBailOutKind() == IR::BailOutOnException)
        {
            // Apart from the exception object sym, lifetimes for all other syms that need to be restored at this bailout,
            // must have been spilled at least once (at the TryCatch, or at the Leave, or both)
            // Post spilling, a lifetime could have been second chance allocated. But, it should still have stack allocated for its sym
            Assert(stackSym->IsAllocated() || (stackSym == this->currentRegion->GetExceptionObjectSym()));
        }

        this->PrepareForUse(lifetime);

        if (instr->HasLazyBailOut() && instr->GetBailOutInfo()->GetClearedUseOfDstId() == stackSym->m_id)
        {
            // Force value of bytecode upward exposed destination symbol of a call instruction
            // with lazy bailout to be restored from `rax`
            // We clear the bit in bytecode upward exposed for destination symbol of a call
            // instructions with lazy bailout in globopt to get past the assert that the
            // register hasn't been initialized yet.
            // Now, since the value is actually in rax, during FillBailOutRecord,
            // we can always force the bailout to restore that symbol from rax.
#ifdef _M_X64
            *offset = this->SaveSymbolToReg(RegRAX, state, stackSym);
#elif _M_IX86
            *offset = this->SaveSymbolToReg(RegEAX, state, stackSym);
#else
            AssertMsg(false, "Lazy bailout for ARM is not yet supported");
#endif
        }
        else if (lifetime->isSpilled ||
            ((instr->GetBailOutKind() == IR::BailOutOnException) && (stackSym != this->currentRegion->GetExceptionObjectSym()))) // BailOutOnException must restore from memory
        {
            Assert(stackSym->IsAllocated() || lifetime->isDeadStore);
#ifdef MD_GROW_LOCALS_AREA_UP
            *offset = -((int)stackSym->m_offset + BailOutInfo::StackSymBias);
#else
            // Stack offset are negative, includes the PUSH EBP and return address
            *offset = stackSym->m_offset - (2 * MachPtr);
#endif
        }
        else
        {
            *offset = this->SaveSymbolToReg(lifetime->reg, state, stackSym);
        }
    }
}